

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O1

void __thiscall
TempTracker<ObjectTemp>::MergeData
          (TempTracker<ObjectTemp> *this,TempTracker<ObjectTemp> *fromData,bool deleteData)

{
  Type this_00;
  undefined7 in_register_00000011;
  
  TempTrackerBase::MergeData((TempTrackerBase *)this,(TempTrackerBase *)fromData,deleteData);
  TempTrackerBase::MergeData((TempTrackerBase *)this,(TempTrackerBase *)fromData,deleteData);
  if ((int)CONCAT71(in_register_00000011,deleteData) != 0) {
    this_00 = (this->super_ObjectTemp).super_TempTrackerBase.nonTempSyms.alloc;
    TempTrackerBase::~TempTrackerBase((TempTrackerBase *)fromData);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
               fromData,0x48);
    return;
  }
  return;
}

Assistant:

void
TempTracker<T>::MergeData(TempTracker<T> * fromData, bool deleteData)
{
    TempTrackerBase::MergeData(fromData, deleteData);
    T::MergeData(fromData, deleteData);

    if (deleteData)
    {
        JitAdelete(this->GetAllocator(), fromData);
    }
}